

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O2

bool __thiscall MIDIplay::doRolandSysEx(MIDIplay *this,uint dev,uint8_t *data,size_t size)

{
  byte bVar1;
  DebugMessageHook p_Var2;
  pointer pMVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  size_t i;
  long lVar13;
  
  uVar5 = 0;
  if ((size < 6) || (dev != 0x7f && (dev & 0xf) != (uint)this->m_sysExDeviceId)) goto LAB_00131365;
  cVar10 = '\0';
  for (lVar13 = 0; size - 3 != lVar13; lVar13 = lVar13 + 1) {
    cVar10 = cVar10 + data[lVar13 + 2];
  }
  if ((-cVar10 & 0x7fU) != (data[size - 1] & 0x7f)) {
    p_Var2 = (this->hooks).onDebugMessage;
    if (p_Var2 != (DebugMessageHook)0x0) {
      uVar5 = 0;
      (*p_Var2)((this->hooks).onDebugMessage_userData,"SysEx: Caught invalid roland SysEx message!")
      ;
      goto LAB_00131365;
    }
    goto LAB_00131363;
  }
  uVar7 = (data[2] & 0x7f) << 0x10;
  uVar12 = (data[3] & 0x7f) << 8;
  uVar8 = data[4] & 0x7f | uVar12 | uVar7;
  uVar7 = data[4] & 0x7f | uVar12 & 0x7f707f | uVar7;
  uVar5 = 0;
  uVar11 = (ulong)(data[3] & 0xf);
  if (uVar7 != 0x401015) {
    uVar11 = uVar5;
  }
  if ((data[1] & 0x7f) != 0x12) goto LAB_00131365;
  if (uVar7 == 0x401015) {
    uVar8 = 0x401015;
  }
  uVar8 = (*data & 0x7f) << 0x18 | uVar8;
  if (uVar8 == 0x42401015) {
    if (((dev & 0xf0) != 0x10 || size != 7) ||
       (pMVar3 = (this->m_midiChannels).
                 super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       (ulong)(((long)(this->m_midiChannels).
                      super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3) / 0x140) < 0x10))
    goto LAB_00131363;
    bVar1 = data[5];
    p_Var2 = (this->hooks).onDebugMessage;
    if (p_Var2 == (DebugMessageHook)0x0) {
      bVar4 = (&DAT_00197e40)[uVar11];
    }
    else {
      bVar4 = (&DAT_00197e40)[uVar11];
      (*p_Var2)((this->hooks).onDebugMessage_userData,
                "SysEx: Caught Roland Percussion set: %02X on channel %u (from %X)",
                (ulong)(bVar1 & 0x7f),(ulong)bVar4);
      pMVar3 = (this->m_midiChannels).
               super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    pMVar3[bVar4].is_xg_percussion = (byte)((char)(bVar1 & 0x7f) - 1U) < 2;
  }
  else {
    if (uVar8 == 0x4240007f) {
      if ((dev & 0xf0) != 0x10 || size != 7) goto LAB_00131363;
      p_Var2 = (this->hooks).onDebugMessage;
      if (p_Var2 != (DebugMessageHook)0x0) {
        bVar1 = data[5];
        pvVar9 = (this->hooks).onDebugMessage_userData;
        pcVar6 = "SysEx: Caught Roland Mode Set: %02X";
        goto LAB_0013131a;
      }
    }
    else {
      if ((uVar8 != 0x4200007f) || ((dev & 0xf0) != 0x10 || size != 7)) {
LAB_00131363:
        uVar5 = 0;
        goto LAB_00131365;
      }
      p_Var2 = (this->hooks).onDebugMessage;
      if (p_Var2 != (DebugMessageHook)0x0) {
        bVar1 = data[5];
        pvVar9 = (this->hooks).onDebugMessage_userData;
        pcVar6 = "SysEx: Caught Roland System Mode Set: %02X";
LAB_0013131a:
        (*p_Var2)(pvVar9,pcVar6,(ulong)(bVar1 & 0x7f));
      }
    }
    this->m_synthMode = 1;
    realTime_ResetState(this);
  }
  uVar5 = 1;
LAB_00131365:
  return SUB81(uVar5,0);
}

Assistant:

bool MIDIplay::doRolandSysEx(unsigned dev, const uint8_t *data, size_t size)
{
    bool devicematch = dev == 0x7F || (dev & 0x0F) == m_sysExDeviceId;
    if(size < 6 || !devicematch)
        return false;

    unsigned model = data[0] & 0x7F;
    unsigned mode = data[1] & 0x7F;
    unsigned checksum = data[size - 1] & 0x7F;
    data += 2;
    size -= 3;

#if !defined(ADLMIDI_SKIP_ROLAND_CHECKSUM)
    {
        unsigned checkvalue = 0;
        for(size_t i = 0; i < size; ++i)
            checkvalue += data[i] & 0x7F;
        checkvalue = (128 - (checkvalue & 127)) & 127;
        if(checkvalue != checksum)
        {
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught invalid roland SysEx message!");
            return false;
        }
    }
#endif

    unsigned address =
        (((unsigned)data[0] & 0x7F) << 16) |
        (((unsigned)data[1] & 0x7F) << 8)  |
        (((unsigned)data[2] & 0x7F));
    unsigned target_channel = 0;

    /* F0 41 10 42 12 40 00 7F 00 41 F7 */

    if((address & 0xFFF0FF) == 0x401015) // Turn channel 1 into percussion
    {
        address = 0x401015;
        target_channel = data[1] & 0x0F;
    }

    data += 3;
    size -= 3;

    if(mode != RolandMode_Send) // don't have MIDI-Out reply ability
        return false;

    // Mode Set
    // F0 {41 10 42 12} {40 00 7F} {00 41} F7

    // Custom drum channels
    // F0 {41 10 42 12} {40 1<ch> 15} {<state> <sum>} F7

    switch((model << 24) | address)
    {
    case (RolandModel_GS << 24) | 0x00007F: // System Mode Set
    {
        if(size != 1 || (dev & 0xF0) != 0x10)
            break;
        unsigned mode = data[0] & 0x7F;
        ADL_UNUSED(mode);//TODO: Hook this correctly!
        if(hooks.onDebugMessage)
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught Roland System Mode Set: %02X", mode);
        m_synthMode = Mode_GS;
        realTime_ResetState();
        return true;
    }
    case (RolandModel_GS << 24) | 0x40007F: // Mode Set
    {
        if(size != 1 || (dev & 0xF0) != 0x10)
            break;
        unsigned value = data[0] & 0x7F;
        ADL_UNUSED(value);//TODO: Hook this correctly!
        if(hooks.onDebugMessage)
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught Roland Mode Set: %02X", value);
        m_synthMode = Mode_GS;
        realTime_ResetState();
        return true;
    }
    case (RolandModel_GS << 24) | 0x401015: // Percussion channel
    {
        if(size != 1 || (dev & 0xF0) != 0x10)
            break;
        if(m_midiChannels.size() < 16)
            break;
        unsigned value = data[0] & 0x7F;
        const uint8_t channels_map[16] =
        {
            9, 0, 1, 2, 3, 4, 5, 6, 7, 8, 10, 11, 12, 13, 14, 15
        };
        if(hooks.onDebugMessage)
            hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                 "SysEx: Caught Roland Percussion set: %02X on channel %u (from %X)",
                                 value, channels_map[target_channel], target_channel);
        m_midiChannels[channels_map[target_channel]].is_xg_percussion = ((value == 0x01)) || ((value == 0x02));
        return true;
    }
    }

    return false;
}